

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  PositionType PVar1;
  string *psVar2;
  bool bVar3;
  const_iterator __first;
  const_iterator __last;
  ulong uVar4;
  reference ppcVar5;
  cmMakefile *this_00;
  cmState *this_01;
  char *pcVar6;
  allocator local_261;
  string local_260;
  string local_240;
  cmStateSnapshot local_220;
  undefined1 local_208 [8];
  cmOutputConverter conv;
  string tname;
  string local_1c0;
  cmStateDirectory local_1a0;
  allocator local_171;
  string local_170;
  cmStateDirectory local_150;
  undefined1 local_128 [8];
  cmStateSnapshot snapshot;
  cmMakefile *mf;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  const_iterator local_e8;
  allocator local_d9;
  value_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_3a;
  byte local_39;
  bool param_8_local;
  string *psStack_38;
  bool fast_local;
  string *targetName_local;
  string *param_4_local;
  string *param_3_local;
  string *makeProgram_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makeCommand_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_39 = fast;
  local_3a = param_8;
  psStack_38 = targetName;
  targetName_local = param_4;
  param_4_local = param_3;
  param_3_local = makeProgram;
  makeProgram_local = (string *)makeCommand;
  makeCommand_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"",&local_81);
  cmGlobalGenerator::SelectMakeProgram(&local_60,(cmGlobalGenerator *)this,makeProgram,&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(makeCommand,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])();
  bVar3 = cmHasLiteralPrefix<std::__cxx11::string,16ul>(&local_b8,(char (*) [16])"NMake Makefiles");
  std::__cxx11::string::~string((string *)&local_b8);
  psVar2 = makeProgram_local;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"/NOLOGO",&local_d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar2,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  psVar2 = makeProgram_local;
  local_f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)makeProgram_local);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_e8,&local_f0);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(makeOptions);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(makeOptions);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)psVar2,local_e8,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::empty
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles);
    if (bVar3) {
      cmake::GetCurrentSnapshot
                ((cmStateSnapshot *)local_128,
                 (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
      cmStateSnapshot::GetDirectory(&local_150,(cmStateSnapshot *)local_128);
      pcVar6 = cmake::GetHomeDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,pcVar6,&local_171);
      cmStateDirectory::SetCurrentSource(&local_150,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      cmStateSnapshot::GetDirectory(&local_1a0,(cmStateSnapshot *)local_128);
      pcVar6 = cmake::GetHomeOutputDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c0,pcVar6,(allocator *)(tname.field_2._M_local_buf + 0xf));
      cmStateDirectory::SetCurrentBinary(&local_1a0,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)(tname.field_2._M_local_buf + 0xf));
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_128);
      this_00 = (cmMakefile *)operator_new(0x760);
      cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,(cmStateSnapshot *)local_128);
      snapshot.Position.Position = (PositionType)this_00;
    }
    else {
      ppcVar5 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                          (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
                           0);
      snapshot.Position.Position = (PositionType)*ppcVar5;
    }
    std::__cxx11::string::string((string *)&conv.LinkScriptShell,(string *)psStack_38);
    if ((local_39 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)&conv.LinkScriptShell,"/fast");
    }
    cmMakefile::GetStateSnapshot(&local_220,(cmMakefile *)snapshot.Position.Position);
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_208,&local_220);
    this_01 = cmMakefile::GetState((cmMakefile *)snapshot.Position.Position);
    pcVar6 = cmState::GetBinaryDirectory(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,pcVar6,&local_261);
    cmOutputConverter::ConvertToRelativePath
              (&local_240,(cmOutputConverter *)local_208,&local_260,(string *)&conv.LinkScriptShell)
    ;
    std::__cxx11::string::operator=((string *)&conv.LinkScriptShell,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    cmSystemTools::ConvertToOutputSlashes((string *)&conv.LinkScriptShell);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)makeProgram_local,(value_type *)&conv.LinkScriptShell);
    bVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::empty
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles);
    PVar1 = snapshot.Position.Position;
    if ((bVar3) && (snapshot.Position.Position != 0)) {
      cmMakefile::~cmMakefile((cmMakefile *)snapshot.Position.Position);
      operator_delete((void *)PVar1,0x760);
    }
    std::__cxx11::string::~string((string *)&conv.LinkScriptShell);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::GenerateBuildCommand(
  std::vector<std::string>& makeCommand, const std::string& makeProgram,
  const std::string& /*projectName*/, const std::string& /*projectDir*/,
  const std::string& targetName, const std::string& /*config*/, bool fast,
  bool /*verbose*/, std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(this->SelectMakeProgram(makeProgram));

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles")) {
    makeCommand.push_back("/NOLOGO");
  }
  makeCommand.insert(makeCommand.end(), makeOptions.begin(),
                     makeOptions.end());
  if (!targetName.empty()) {
    cmMakefile* mf;
    if (!this->Makefiles.empty()) {
      mf = this->Makefiles[0];
    } else {
      cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
      snapshot.GetDirectory().SetCurrentSource(
        this->CMakeInstance->GetHomeDirectory());
      snapshot.GetDirectory().SetCurrentBinary(
        this->CMakeInstance->GetHomeOutputDirectory());
      snapshot.SetDefaultDefinitions();
      mf = new cmMakefile(this, snapshot);
    }

    std::string tname = targetName;
    if (fast) {
      tname += "/fast";
    }
    cmOutputConverter conv(mf->GetStateSnapshot());
    tname =
      conv.ConvertToRelativePath(mf->GetState()->GetBinaryDirectory(), tname);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->Makefiles.empty()) {
      delete mf;
    }
  }
}